

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * loadtxoutset(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff678;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff680;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff690;
  string *in_stack_fffffffffffff6a8;
  string *in_stack_fffffffffffff6b0;
  allocator<char> *in_stack_fffffffffffff6b8;
  iterator in_stack_fffffffffffff6c0;
  RPCArgOptions *in_stack_fffffffffffff6c8;
  string *in_stack_fffffffffffff6d0;
  undefined7 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6df;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff6e0;
  string *in_stack_fffffffffffff6e8;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff6f0;
  RPCResults *in_stack_fffffffffffff6f8;
  RPCResult *in_stack_fffffffffffff700;
  undefined1 *local_8f8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  RPCHelpMan *name;
  RPCHelpMan *this_00;
  allocator<char> local_78b;
  allocator<char> local_78a [2];
  pointer local_788;
  pointer pRStack_780;
  pointer local_778;
  allocator<char> local_76a;
  allocator<char> local_769 [31];
  allocator<char> local_74a;
  allocator<char> local_749 [31];
  allocator<char> local_72a;
  allocator<char> local_729 [9];
  undefined8 fun;
  allocator<char> local_70a;
  allocator<char> local_709 [31];
  allocator<char> local_6ea;
  allocator<char> local_6e9 [32];
  undefined1 local_6c9 [8];
  RPCResults local_6c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_6a2 [16];
  undefined1 local_520 [544];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (RPCHelpMan *)
            ((long)&local_6a2[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  args = local_6a2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  results = &local_6c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_6c9._1_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff688,(Optional *)in_stack_fffffffffffff680);
  examples = (RPCExamples *)local_6c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff690);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff678);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                 (Type)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff678);
  __l._M_len = (size_type)in_stack_fffffffffffff6c8;
  __l._M_array = in_stack_fffffffffffff6c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8,__l,
             (allocator_type *)in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_729[1] = (allocator<char>)0x0;
  local_729[2] = (allocator<char>)0x0;
  local_729[3] = (allocator<char>)0x0;
  local_729[4] = (allocator<char>)0x0;
  local_729[5] = (allocator<char>)0x0;
  local_729[6] = (allocator<char>)0x0;
  local_729[7] = (allocator<char>)0x0;
  local_729[8] = (allocator<char>)0x0;
  fun = (RPCMethodImpl *)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff678);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,(Type)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             &in_stack_fffffffffffff6f0->m_names,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
             ,(bool)in_stack_fffffffffffff6df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_749[1] = (allocator<char>)0x0;
  local_749[2] = (allocator<char>)0x0;
  local_749[3] = (allocator<char>)0x0;
  local_749[4] = (allocator<char>)0x0;
  local_749[5] = (allocator<char>)0x0;
  local_749[6] = (allocator<char>)0x0;
  local_749[7] = (allocator<char>)0x0;
  local_749[8] = (allocator<char>)0x0;
  local_749[9] = (allocator<char>)0x0;
  local_749[10] = (allocator<char>)0x0;
  local_749[0xb] = (allocator<char>)0x0;
  local_749[0xc] = (allocator<char>)0x0;
  local_749[0xd] = (allocator<char>)0x0;
  local_749[0xe] = (allocator<char>)0x0;
  local_749[0xf] = (allocator<char>)0x0;
  local_749[0x10] = (allocator<char>)0x0;
  local_749[0x11] = (allocator<char>)0x0;
  local_749[0x12] = (allocator<char>)0x0;
  local_749[0x13] = (allocator<char>)0x0;
  local_749[0x14] = (allocator<char>)0x0;
  local_749[0x15] = (allocator<char>)0x0;
  local_749[0x16] = (allocator<char>)0x0;
  local_749[0x17] = (allocator<char>)0x0;
  local_749[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff678);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,(Type)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             &in_stack_fffffffffffff6f0->m_names,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
             ,(bool)in_stack_fffffffffffff6df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_769[1] = (allocator<char>)0x0;
  local_769[2] = (allocator<char>)0x0;
  local_769[3] = (allocator<char>)0x0;
  local_769[4] = (allocator<char>)0x0;
  local_769[5] = (allocator<char>)0x0;
  local_769[6] = (allocator<char>)0x0;
  local_769[7] = (allocator<char>)0x0;
  local_769[8] = (allocator<char>)0x0;
  local_769[9] = (allocator<char>)0x0;
  local_769[10] = (allocator<char>)0x0;
  local_769[0xb] = (allocator<char>)0x0;
  local_769[0xc] = (allocator<char>)0x0;
  local_769[0xd] = (allocator<char>)0x0;
  local_769[0xe] = (allocator<char>)0x0;
  local_769[0xf] = (allocator<char>)0x0;
  local_769[0x10] = (allocator<char>)0x0;
  local_769[0x11] = (allocator<char>)0x0;
  local_769[0x12] = (allocator<char>)0x0;
  local_769[0x13] = (allocator<char>)0x0;
  local_769[0x14] = (allocator<char>)0x0;
  local_769[0x15] = (allocator<char>)0x0;
  local_769[0x16] = (allocator<char>)0x0;
  local_769[0x17] = (allocator<char>)0x0;
  local_769[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff678);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,(Type)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             &in_stack_fffffffffffff6f0->m_names,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
             ,(bool)in_stack_fffffffffffff6df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_788 = (pointer)0x0;
  pRStack_780 = (pointer)0x0;
  local_778 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff678);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,(Type)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             &in_stack_fffffffffffff6f0->m_names,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
             ,(bool)in_stack_fffffffffffff6df);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff678);
  __l_00._M_len = (size_type)in_stack_fffffffffffff6c8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff6c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8,__l_00,
             (allocator_type *)in_stack_fffffffffffff6b0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,(Type)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             &in_stack_fffffffffffff6f0->m_names,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
             ,(bool)in_stack_fffffffffffff6df);
  RPCResults::RPCResults(in_stack_fffffffffffff6f8,(RPCResult *)in_stack_fffffffffffff6f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  HelpExampleCli(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff678,(string *)0x56d640);
  this = (RPCArg *)&stack0xfffffffffffff850;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<loadtxoutset()::__0,void>(in_stack_fffffffffffff688,in_stack_fffffffffffff680);
  RPCHelpMan::RPCHelpMan
            (this_00,&name->m_name,&in_RDI->m_name,args,results,examples,(RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_78b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_78a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_520;
  local_8f8 = local_300;
  do {
    local_8f8 = local_8f8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_8f8 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_76a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_769);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_74a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_749);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_72a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_729);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_70a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_709);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6e9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff688);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_6c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_6a2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_6a2[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return name;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan loadtxoutset()
{
    return RPCHelpMan{
        "loadtxoutset",
        "Load the serialized UTXO set from a file.\n"
        "Once this snapshot is loaded, its contents will be "
        "deserialized into a second chainstate data structure, which is then used to sync to "
        "the network's tip. "
        "Meanwhile, the original chainstate will complete the initial block download process in "
        "the background, eventually validating up to the block that the snapshot is based upon.\n\n"

        "The result is a usable bitcoind instance that is current with the network tip in a "
        "matter of minutes rather than hours. UTXO snapshot are typically obtained from "
        "third-party sources (HTTP, torrent, etc.) which is reasonable since their "
        "contents are always checked by hash.\n\n"

        "You can find more information on this process in the `assumeutxo` design "
        "document (<https://github.com/bitcoin/bitcoin/blob/master/doc/design/assumeutxo.md>).",
        {
            {"path",
                RPCArg::Type::STR,
                RPCArg::Optional::NO,
                "path to the snapshot file. If relative, will be prefixed by datadir."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::NUM, "coins_loaded", "the number of coins loaded from the snapshot"},
                    {RPCResult::Type::STR_HEX, "tip_hash", "the hash of the base of the snapshot"},
                    {RPCResult::Type::NUM, "base_height", "the height of the base of the snapshot"},
                    {RPCResult::Type::STR, "path", "the absolute path that the snapshot was loaded from"},
                }
        },
        RPCExamples{
            HelpExampleCli("-rpcclienttimeout=0 loadtxoutset", "utxo.dat")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    const fs::path path{AbsPathForConfigVal(EnsureArgsman(node), fs::u8path(self.Arg<std::string>("path")))};

    FILE* file{fsbridge::fopen(path, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        throw JSONRPCError(
            RPC_INVALID_PARAMETER,
            "Couldn't open file " + path.utf8string() + " for reading.");
    }

    SnapshotMetadata metadata{chainman.GetParams().MessageStart()};
    try {
        afile >> metadata;
    } catch (const std::ios_base::failure& e) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("Unable to parse metadata: %s", e.what()));
    }

    auto activation_result{chainman.ActivateSnapshot(afile, metadata, false)};
    if (!activation_result) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, strprintf("Unable to load UTXO snapshot: %s. (%s)", util::ErrorString(activation_result).original, path.utf8string()));
    }

    // Because we can't provide historical blocks during tip or background sync.
    // Update local services to reflect we are a limited peer until we are fully sync.
    node.connman->RemoveLocalServices(NODE_NETWORK);
    // Setting the limited state is usually redundant because the node can always
    // provide the last 288 blocks, but it doesn't hurt to set it.
    node.connman->AddLocalServices(NODE_NETWORK_LIMITED);

    CBlockIndex& snapshot_index{*CHECK_NONFATAL(*activation_result)};

    UniValue result(UniValue::VOBJ);
    result.pushKV("coins_loaded", metadata.m_coins_count);
    result.pushKV("tip_hash", snapshot_index.GetBlockHash().ToString());
    result.pushKV("base_height", snapshot_index.nHeight);
    result.pushKV("path", fs::PathToString(path));
    return result;
},
    };
}